

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  event_base *base;
  long lVar5;
  char *pcVar6;
  int line;
  char *fmt;
  long lVar7;
  event *terminators [2];
  long local_d8 [3];
  _union_1457 local_c0 [17];
  undefined4 local_38;
  
  argp_parse(&arg_def,argc,argv,0,0,&prog_arg);
  _Var1 = cfg_loadf(prog_arg.config_file,app_cfg_items);
  iVar4 = -1;
  if (!_Var1) {
    return -1;
  }
  _Var1 = cdns_validate_cfg();
  if (!_Var1) {
    return -1;
  }
  iVar2 = log_preopen("cdns",g_app_cfg.log,g_app_cfg.log_debug,g_app_cfg.log_info);
  if (iVar2 != 0) {
    main_cold_1();
    return -1;
  }
  log_open();
  if ((g_app_cfg.daemon == true) && (iVar2 = daemon(1,0), iVar2 != 0)) {
    pcVar6 = "main";
    fmt = "daemon";
    line = 0xa0;
    iVar2 = 1;
  }
  else {
    pcVar6 = g_app_cfg.pidfile;
    if (g_app_cfg.pidfile != (char *)0x0) {
      __stream = fopen(g_app_cfg.pidfile,"w");
      if (__stream == (FILE *)0x0) {
        _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",
                   0x114,"write_pidfile",0,4,"Unable to open pidfile for write: %s",pcVar6);
      }
      else {
        uVar3 = getpid();
        fprintf(__stream,"%d\n",(ulong)uVar3);
        fclose(__stream);
      }
    }
    base = (event_base *)event_base_new();
    if (base != (event_base *)0x0) {
      local_d8[0] = 0;
      local_d8[1] = 0;
      lVar7 = 0;
      while( true ) {
        lVar5 = event_new(base,*(undefined4 *)((long)&DAT_00109228 + lVar7),0x18,terminate,base);
        *(long *)((long)local_d8 + lVar7 * 2) = lVar5;
        if (lVar5 == 0) {
          pcVar6 = "evsignal_new";
          lVar7 = 0;
          iVar4 = 0xcb;
          goto LAB_001037cd;
        }
        iVar4 = event_add(lVar5);
        if (iVar4 != 0) break;
        lVar7 = lVar7 + 4;
        if (lVar7 != 4) {
          lVar7 = 0;
          memset(local_c0,0,0x98);
          local_c0[0] = (_union_1457)0x1;
          local_38 = 0x10000000;
          iVar4 = sigaction(0xd,(sigaction *)local_c0,(sigaction *)0x0);
          if (iVar4 != -1) {
            lVar7 = event_new(base,10,0x18,sigusr1_handler,0);
            if (lVar7 == 0) {
              pcVar6 = "evsignal_new";
              lVar7 = 0;
              iVar4 = 0xdd;
            }
            else {
              iVar4 = event_add(lVar7,0);
              if (iVar4 == 0) {
                iVar4 = cdns_init_server(base);
                if (iVar4 != 0) {
                  return 0;
                }
                _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                           ,0x108,"start_server",0,6,"%s started","cdns");
                event_base_dispatch(base);
                event_base_free(base);
                return 0;
              }
              pcVar6 = "evsignal_add";
              iVar4 = 0xe1;
            }
LAB_001037cd:
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                       ,iVar4,"init_signal_handlers",1,3,pcVar6);
          }
          if (lVar7 != 0) {
            iVar4 = event_del(lVar7);
            if (iVar4 != 0) {
              _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                         ,0xea,"init_signal_handlers",1,4,"evsignal_del");
            }
            event_free(lVar7);
          }
          lVar7 = 0;
          do {
            lVar5 = local_d8[lVar7];
            if (lVar5 != 0) {
              iVar4 = event_del(lVar5);
              if (iVar4 != 0) {
                _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c"
                           ,0xf1,"init_signal_handlers",1,4,"evsignal_del");
              }
              event_free(lVar5);
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          return 0;
        }
      }
      pcVar6 = "evsignal_add";
      lVar7 = 0;
      iVar4 = 0xcf;
      goto LAB_001037cd;
    }
    pcVar6 = "start_server";
    fmt = "Unable to initialize libevent base";
    iVar4 = 0;
    line = 0xff;
    iVar2 = 0;
  }
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/main.c",line,
             pcVar6,iVar2,3,fmt);
  return iVar4;
}

Assistant:

int main (int argc, char * argv[])
{
    /* Handle arguments */
    argp_parse (&arg_def, argc, argv, 0, 0, &prog_arg);

    /* init globals */
    init_global_cfg();

    /* Load configurations */
    if (!cfg_loadf(prog_arg.config_file, &app_cfg_items[0]))
        return -1;

    /* Verify configurations */
    if (!cdns_validate_cfg())
        return -1;

    /* Setup logging */
    if (log_preopen("cdns", g_app_cfg.log, g_app_cfg.log_debug, g_app_cfg.log_info)) {
        fprintf(stderr, "Failed to set up logging.\n");
        return -1; 
    } 
    log_open();

    if (g_app_cfg.daemon) {
        if (daemon(1, 0)) {
            log_errno(LOG_ERR, "daemon");
            return -1;
        }
    }
    if (g_app_cfg.pidfile)
        write_pidfile(g_app_cfg.pidfile);
        
    /* Start serving */    
    start_server(); 

    /* Clean up before exit */
    return 0;
}